

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_scaling.c
# Opt level: O0

cupdlp_retcode
cupdlp_pc_scaling(CUPDLPcsc *csc,cupdlp_float *cost,cupdlp_float *lower,cupdlp_float *upper,
                 cupdlp_float *rhs,CUPDLPscaling *scaling)

{
  double *pdVar1;
  double __y;
  int len;
  int iVar2;
  CUPDLPcsc *csc_00;
  int *in_RDI;
  long in_R9;
  double dVar3;
  int i_2;
  int i_1;
  int j;
  int i;
  cupdlp_float *current_row_scaling;
  cupdlp_float *current_col_scaling;
  cupdlp_float alpha;
  cupdlp_int nCols;
  cupdlp_int nRows;
  cupdlp_retcode retcode;
  cupdlp_float *in_stack_ffffffffffffff88;
  cupdlp_float *in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  int in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  cupdlp_float *cost_00;
  undefined4 in_stack_ffffffffffffffc0;
  int len_00;
  cupdlp_retcode local_34;
  
  local_34 = 0;
  len = *in_RDI;
  len_00 = in_RDI[1];
  __y = *(double *)(in_R9 + 0x30);
  cost_00 = (cupdlp_float *)0x0;
  csc_00 = (CUPDLPcsc *)calloc((long)len_00,8);
  if (csc_00 == (CUPDLPcsc *)0x0) {
    local_34 = 1;
  }
  else {
    cost_00 = (cupdlp_float *)calloc((long)len,8);
    if (cost_00 == (cupdlp_float *)0x0) {
      local_34 = 1;
    }
    else {
      if ((2.0 < __y) || (__y < 0.0)) {
        printf("alpha should be in [0, 2]\n");
        exit(1);
      }
      if (0 < len) {
        for (in_stack_ffffffffffffffa4 = 0; in_stack_ffffffffffffffa4 < len_00;
            in_stack_ffffffffffffffa4 = in_stack_ffffffffffffffa4 + 1) {
          for (in_stack_ffffffffffffffa0 =
                    *(int *)(*(long *)(in_RDI + 4) + (long)in_stack_ffffffffffffffa4 * 4);
              in_stack_ffffffffffffffa0 <
              *(int *)(*(long *)(in_RDI + 4) + (long)(in_stack_ffffffffffffffa4 + 1) * 4);
              in_stack_ffffffffffffffa0 = in_stack_ffffffffffffffa0 + 1) {
            pdVar1 = (double *)(*(long *)(in_RDI + 8) + (long)in_stack_ffffffffffffffa0 * 8);
            if (0.0 < *pdVar1 || *pdVar1 == 0.0) {
              in_stack_ffffffffffffff90 =
                   *(cupdlp_float **)(*(long *)(in_RDI + 8) + (long)in_stack_ffffffffffffffa0 * 8);
            }
            else {
              in_stack_ffffffffffffff90 =
                   (cupdlp_float *)
                   ((ulong)*(double *)(*(long *)(in_RDI + 8) + (long)in_stack_ffffffffffffffa0 * 8)
                   ^ 0x8000000000000000);
            }
            dVar3 = pow((double)in_stack_ffffffffffffff90,__y);
            *(double *)(&csc_00->nRows + (long)in_stack_ffffffffffffffa4 * 2) =
                 dVar3 + *(double *)(&csc_00->nRows + (long)in_stack_ffffffffffffffa4 * 2);
          }
          dVar3 = pow(*(double *)(&csc_00->nRows + (long)in_stack_ffffffffffffffa4 * 2),1.0 / __y);
          dVar3 = sqrt(dVar3);
          *(double *)(&csc_00->nRows + (long)in_stack_ffffffffffffffa4 * 2) = dVar3;
          if ((*(double *)(&csc_00->nRows + (long)in_stack_ffffffffffffffa4 * 2) == 0.0) &&
             (!NAN(*(double *)(&csc_00->nRows + (long)in_stack_ffffffffffffffa4 * 2)))) {
            *(undefined8 *)(&csc_00->nRows + (long)in_stack_ffffffffffffffa4 * 2) =
                 0x3ff0000000000000;
          }
        }
        for (in_stack_ffffffffffffff9c = 0;
            in_stack_ffffffffffffff9c < *(int *)(*(long *)(in_RDI + 4) + (long)len_00 * 4);
            in_stack_ffffffffffffff9c = in_stack_ffffffffffffff9c + 1) {
          pdVar1 = (double *)(*(long *)(in_RDI + 8) + (long)in_stack_ffffffffffffff9c * 8);
          if (0.0 < *pdVar1 || *pdVar1 == 0.0) {
            in_stack_ffffffffffffff88 =
                 *(cupdlp_float **)(*(long *)(in_RDI + 8) + (long)in_stack_ffffffffffffff9c * 8);
          }
          else {
            in_stack_ffffffffffffff88 =
                 (cupdlp_float *)
                 ((ulong)*(double *)(*(long *)(in_RDI + 8) + (long)in_stack_ffffffffffffff9c * 8) ^
                 0x8000000000000000);
          }
          dVar3 = pow((double)in_stack_ffffffffffffff88,2.0 - __y);
          iVar2 = *(int *)(*(long *)(in_RDI + 6) + (long)in_stack_ffffffffffffff9c * 4);
          cost_00[iVar2] = dVar3 + cost_00[iVar2];
        }
        for (in_stack_ffffffffffffff98 = 0; in_stack_ffffffffffffff98 < len;
            in_stack_ffffffffffffff98 = in_stack_ffffffffffffff98 + 1) {
          dVar3 = pow(cost_00[in_stack_ffffffffffffff98],1.0 / (2.0 - __y));
          dVar3 = sqrt(dVar3);
          cost_00[in_stack_ffffffffffffff98] = dVar3;
          if ((cost_00[in_stack_ffffffffffffff98] == 0.0) &&
             (!NAN(cost_00[in_stack_ffffffffffffff98]))) {
            cost_00[in_stack_ffffffffffffff98] = 1.0;
          }
        }
      }
      scale_problem(csc_00,cost_00,
                    (cupdlp_float *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                    (cupdlp_float *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                    in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                    (cupdlp_float *)CONCAT44(len_00,in_stack_ffffffffffffffc0));
      cupdlp_cdot(*(cupdlp_float **)(in_R9 + 0x10),(cupdlp_float *)csc_00,len_00);
      cupdlp_cdot(*(cupdlp_float **)(in_R9 + 8),cost_00,len);
    }
  }
  free(csc_00);
  free(cost_00);
  return local_34;
}

Assistant:

cupdlp_retcode cupdlp_pc_scaling(CUPDLPcsc *csc, cupdlp_float *cost,
                                 cupdlp_float *lower, cupdlp_float *upper,
                                 cupdlp_float *rhs, CUPDLPscaling *scaling)
// cupdlp_retcode cupdlp_pc_scaling(CUPDLPwork *work, cupdlp_float alpha)
{
  cupdlp_retcode retcode = RETCODE_OK;
  cupdlp_int nRows = csc->nRows;
  cupdlp_int nCols = csc->nCols;
  cupdlp_float alpha = scaling->PcAlpha;

  cupdlp_float *current_col_scaling = NULL;  // for variable
  cupdlp_float *current_row_scaling = NULL;  // for constraint
  CUPDLP_INIT_ZERO_DOUBLE(current_col_scaling, nCols);
  CUPDLP_INIT_ZERO_DOUBLE(current_row_scaling, nRows);

  if (alpha > 2.0 || alpha < 0.0) {
    cupdlp_printf("alpha should be in [0, 2]\n");
    exit(1);
  }

  if (nRows > 0) {
    for (int i = 0; i < nCols; i++) {
      for (int j = csc->colMatBeg[i]; j < csc->colMatBeg[i + 1]; j++) {
        current_col_scaling[i] += POWF(ABS(csc->colMatElem[j]), alpha);
      }
      current_col_scaling[i] = SQRTF(POWF(current_col_scaling[i], 1.0 / alpha));
      if (current_col_scaling[i] == 0.0) {
        current_col_scaling[i] = 1.0;
      }
    }

    for (int i = 0; i < csc->colMatBeg[nCols]; i++) {
      current_row_scaling[csc->colMatIdx[i]] +=
          POWF(ABS(csc->colMatElem[i]), 2.0 - alpha);
    }
    for (int i = 0; i < nRows; i++) {
      current_row_scaling[i] =
          SQRTF(POWF(current_row_scaling[i], 1.0 / (2.0 - alpha)));
      if (current_row_scaling[i] == 0.0) {
        current_row_scaling[i] = 1.0;
      }
    }
  }

  // apply scaling
  // scale_problem(work, current_col_scaling, current_row_scaling);
  scale_problem(csc, cost, lower, upper, rhs, current_col_scaling,
                current_row_scaling);

  // update scaling
  cupdlp_cdot(scaling->colScale, current_col_scaling, nCols);
  cupdlp_cdot(scaling->rowScale, current_row_scaling, nRows);

exit_cleanup:
  cupdlp_free(current_col_scaling);
  cupdlp_free(current_row_scaling);
  return retcode;
}